

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void smoke_test(void)

{
  bool bVar1;
  type pjVar2;
  type pjVar3;
  allocator local_179;
  string local_178 [32];
  undefined1 local_158 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j2_1;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  undefined1 local_100 [16];
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1_1;
  string local_98 [32];
  undefined1 local_78 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j2;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  undefined1 local_10 [8];
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"test_files/test2.json",&local_31);
  argo::parser::load((parser *)local_10,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"test_files/tmp.json",
             (allocator *)
             ((long)&j2._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  argo::unparser::save(pjVar2,(string *)local_68," ",""," ",0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&j2._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"test_files/test2.json",
             (allocator *)
             ((long)&j1_1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  argo::parser::load((parser *)local_78,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&j1_1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_10);
  pjVar3 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_78);
  bVar1 = argo::json::operator==(pjVar2,pjVar3);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: load and dump and load again produced equal results\n");
  }
  else {
    std::operator<<((ostream *)jlog,"FAIL: load and dump and load again produced unequal results\n")
    ;
  }
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_78);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"test_files/test2.json",&local_c9);
  argo::parser::load((parser *)local_a8,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"test_files/tmp.json",(allocator *)(local_100 + 0xf));
  argo::unparser::save(pjVar2,(string *)local_f0," ",""," ",0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"test_files/tmp.json",&local_121);
  argo::parser::load((parser *)local_100,(string *)local_120);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator=
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_a8,
             (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_100);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"test_files/tmp.json",
             (allocator *)
             ((long)&j2_1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  argo::unparser::save(pjVar2,(string *)local_148," ",""," ",0);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&j2_1._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>.
                     _M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                     super__Head_base<0UL,_argo::json_*,_false>._M_head_impl + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"test_files/tmp.json",&local_179);
  argo::parser::load((parser *)local_158,(string *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_a8);
  pjVar3 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                     ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_158);
  bVar1 = argo::json::operator==(pjVar2,pjVar3);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: load and dump and load again produced equal results\n");
  }
  else {
    std::operator<<((ostream *)jlog,"FAIL: load and dump and load again produced unequal results\n")
    ;
  }
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_158);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_a8);
  return;
}

Assistant:

void smoke_test()
{
    {
        auto j1 = parser::load("test_files/test2.json");
        unparser::save(*j1, "test_files/tmp.json");
        auto j2 = parser::load("test_files/test2.json");
        if (*j1 == *j2)
        {
            jlog << "PASS: load and dump and load again produced equal results\n";
        }
        else
        {
            jlog << "FAIL: load and dump and load again produced unequal results\n";
        }
    }

    // now with conversions and an extre dump/load cycle to get everything into the same state
    {
        auto j1 = parser::load("test_files/test2.json");
        unparser::save(*j1, "test_files/tmp.json");

        j1 = parser::load("test_files/tmp.json");
        unparser::save(*j1, "test_files/tmp.json");

        auto j2 = parser::load("test_files/tmp.json");

        if (*j1 == *j2)
        {
            jlog << "PASS: load and dump and load again produced equal results\n";
        }
        else
        {
            jlog << "FAIL: load and dump and load again produced unequal results\n";
        }
    }
}